

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::writeSysex(Synth *this,Bit8u device,Bit8u *sysex,Bit32u len)

{
  bool bVar1;
  Bit32u len_00;
  Bit8u *sysex_00;
  Bit8u (*paBVar2) [9];
  int local_48;
  uint local_44;
  int offset_1;
  Bit32u partIx_1;
  Bit8u *chanParts_1;
  int offset;
  Bit32u partIx;
  Bit8u *chanParts;
  Bit32u addr;
  Bit32u len_local;
  Bit8u *sysex_local;
  Bit8u device_local;
  Synth *this_local;
  
  if (((this->opened & 1U) != 0) && (len != 0)) {
    if (*sysex == '\x7f') {
      bVar1 = isDisplayOldMT32Compatible(this);
      if (!bVar1) {
        Display::midiMessagePlayed(this->extensions->display);
      }
      reset(this);
    }
    else {
      Display::midiMessagePlayed(this->extensions->display);
      (*this->reportHandler->_vptr_ReportHandler[6])();
      if (len < 3) {
        if (*sysex == ' ') {
          Display::displayControlMessageReceived(this->extensions->display,sysex,len);
        }
        else {
          printDebug(this,"writeSysex: Message is too short (%d bytes)!",(ulong)len);
        }
      }
      else {
        chanParts._0_4_ =
             ((*sysex & 0x7f) << 0x10) >> 2 | ((sysex[1] & 0x7f) << 8) >> 1 | sysex[2] & 0x7f;
        sysex_00 = sysex + 3;
        len_00 = len - 3;
        if (device < 0x10) {
          if ((uint)chanParts < 0x4000) {
            chanParts._0_4_ = (uint)chanParts + 0xc000;
            paBVar2 = this->extensions->chantable + device;
            if ((*paBVar2)[0] < 9) {
              chanParts_1._4_4_ = 0;
              while( true ) {
                if (8 < chanParts_1._4_4_) {
                  return;
                }
                if (8 < (*paBVar2)[chanParts_1._4_4_]) break;
                if ((*paBVar2)[chanParts_1._4_4_] == '\b') {
                  chanParts_1._0_4_ = 0;
                }
                else {
                  chanParts_1._0_4_ = (uint)(*paBVar2)[chanParts_1._4_4_] << 4;
                }
                writeSysexGlobal(this,(uint)chanParts + (int)chanParts_1,sysex_00,len_00);
                chanParts_1._4_4_ = chanParts_1._4_4_ + 1;
              }
              return;
            }
          }
          else if ((uint)chanParts < 0x8000) {
            chanParts._0_4_ = (uint)chanParts + 0x8090;
          }
          else {
            if (0xbfff < (uint)chanParts) {
              return;
            }
            chanParts._0_4_ = (uint)chanParts + 0x8000;
            paBVar2 = this->extensions->chantable + device;
            if ((*paBVar2)[0] < 9) {
              local_44 = 0;
              while( true ) {
                if (8 < local_44) {
                  return;
                }
                if (8 < (*paBVar2)[local_44]) break;
                if ((*paBVar2)[local_44] == '\b') {
                  local_48 = 0;
                }
                else {
                  local_48 = (uint)(*paBVar2)[local_44] * 0xf6;
                }
                writeSysexGlobal(this,(uint)chanParts + local_48,sysex_00,len_00);
                local_44 = local_44 + 1;
              }
              return;
            }
          }
        }
        writeSysexGlobal(this,(uint)chanParts,sysex_00,len_00);
      }
    }
  }
  return;
}

Assistant:

void Synth::writeSysex(Bit8u device, const Bit8u *sysex, Bit32u len) {
	if (!opened || len < 1) return;

	// This is checked early in the real devices (before any sysex length checks or further processing)
	if (sysex[0] == 0x7F) {
		if (!isDisplayOldMT32Compatible()) extensions.display->midiMessagePlayed();
		reset();
		return;
	}

	extensions.display->midiMessagePlayed();
	reportHandler->onMIDIMessagePlayed();

	if (len < 3) {
		// A short message of just 1 or 2 bytes may be written to the display area yet it may cause a user-visible effect,
		// similarly to the reset area.
		if (sysex[0] == 0x20) {
			extensions.display->displayControlMessageReceived(sysex, len);
			return;
		}
		printDebug("writeSysex: Message is too short (%d bytes)!", len);
		return;
	}

	Bit32u addr = (sysex[0] << 16) | (sysex[1] << 8) | (sysex[2]);
	addr = MT32EMU_MEMADDR(addr);
	sysex += 3;
	len -= 3;

	//printDebug("Sysex addr: 0x%06x", MT32EMU_SYSEXMEMADDR(addr));
	// NOTE: Please keep both lower and upper bounds in each check, for ease of reading

	// Process channel-specific sysex by converting it to device-global
	if (device < 0x10) {
#if MT32EMU_MONITOR_SYSEX > 0
		printDebug("WRITE-CHANNEL: Channel %d temp area 0x%06x", device, MT32EMU_SYSEXMEMADDR(addr));
#endif
		if (/*addr >= MT32EMU_MEMADDR(0x000000) && */addr < MT32EMU_MEMADDR(0x010000)) {
			addr += MT32EMU_MEMADDR(0x030000);
			Bit8u *chanParts = extensions.chantable[device];
			if (*chanParts > 8) {
#if MT32EMU_MONITOR_SYSEX > 0
				printDebug(" (Channel not mapped to a part... 0 offset)");
#endif
			} else {
				for (Bit32u partIx = 0; partIx <= 8; partIx++) {
					if (chanParts[partIx] > 8) break;
					int offset;
					if (chanParts[partIx] == 8) {
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Channel mapped to rhythm... 0 offset)");
#endif
						offset = 0;
					} else {
						offset = chanParts[partIx] * sizeof(MemParams::PatchTemp);
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Setting extra offset to %d)", offset);
#endif
					}
					writeSysexGlobal(addr + offset, sysex, len);
				}
				return;
			}
		} else if (/*addr >= MT32EMU_MEMADDR(0x010000) && */ addr < MT32EMU_MEMADDR(0x020000)) {
			addr += MT32EMU_MEMADDR(0x030110) - MT32EMU_MEMADDR(0x010000);
		} else if (/*addr >= MT32EMU_MEMADDR(0x020000) && */ addr < MT32EMU_MEMADDR(0x030000)) {
			addr += MT32EMU_MEMADDR(0x040000) - MT32EMU_MEMADDR(0x020000);
			Bit8u *chanParts = extensions.chantable[device];
			if (*chanParts > 8) {
#if MT32EMU_MONITOR_SYSEX > 0
				printDebug(" (Channel not mapped to a part... 0 offset)");
#endif
			} else {
				for (Bit32u partIx = 0; partIx <= 8; partIx++) {
					if (chanParts[partIx] > 8) break;
					int offset;
					if (chanParts[partIx] == 8) {
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Channel mapped to rhythm... 0 offset)");
#endif
						offset = 0;
					} else {
						offset = chanParts[partIx] * sizeof(TimbreParam);
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Setting extra offset to %d)", offset);
#endif
					}
					writeSysexGlobal(addr + offset, sysex, len);
				}
				return;
			}
		} else {
#if MT32EMU_MONITOR_SYSEX > 0
			printDebug(" Invalid channel");
#endif
			return;
		}
	}
	writeSysexGlobal(addr, sysex, len);
}